

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall QMdi::ControlLabel::ControlLabel(ControlLabel *this,QWidget *parent)

{
  undefined4 uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar5 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar6 [16];
  QSize local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::QWidget(&this->super_QWidget,parent,(WindowFlags)0x0);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_00803fe8;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__ControlLabel_00804198;
  QPixmap::QPixmap(&this->label);
  this->isPressed = false;
  QWidget::setFocusPolicy(&this->super_QWidget,NoFocus);
  updateWindowIcon(this);
  uVar1 = QPixmap::deviceIndependentSize();
  auVar6._0_8_ = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                 extraout_XMM1_Qa;
  auVar6._8_8_ = (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                 extraout_XMM0_Qa;
  auVar6 = minpd(_DAT_0066f5d0,auVar6);
  auVar5._8_8_ = -(ulong)(-2147483648.0 < auVar6._8_8_);
  auVar5._0_8_ = -(ulong)(-2147483648.0 < auVar6._0_8_);
  uVar2 = movmskpd(uVar1,auVar5);
  uVar4 = 0x8000000000000000;
  if ((uVar2 & 1) != 0) {
    uVar4 = (ulong)(uint)(int)auVar6._0_8_ << 0x20;
  }
  uVar3 = 0x80000000;
  if ((uVar2 & 2) != 0) {
    uVar3 = (ulong)(uint)(int)auVar6._8_8_;
  }
  local_20 = (QSize)(uVar3 | uVar4);
  QWidget::setFixedSize(&this->super_QWidget,&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ControlLabel::ControlLabel(QWidget *parent)
    : QWidget(parent), isPressed(false)
{
    setFocusPolicy(Qt::NoFocus);
    updateWindowIcon();
    setFixedSize(label.deviceIndependentSize().toSize());
}